

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O0

int tx_get_signature_hash
              (wally_tx *tx,size_t index,uchar *script,size_t script_len,uchar *extra,
              size_t extra_len,uint32_t extra_offset,uint64_t satoshi,uchar *value,size_t value_len,
              uint32_t sighash,uint32_t tx_sighash,uint32_t flags,uchar *bytes_out,size_t len)

{
  _Bool _Var1;
  undefined1 local_8b0 [8];
  tx_serialize_opts opts;
  size_t sStack_868;
  int ret;
  size_t is_elements;
  size_t n2;
  size_t n;
  uchar *buff_p;
  uchar buff [2048];
  size_t extra_len_local;
  uchar *extra_local;
  size_t script_len_local;
  uchar *script_local;
  size_t index_local;
  wally_tx *tx_local;
  
  n = (size_t)&buff_p;
  sStack_868 = 0;
  local_8b0._0_4_ = sighash;
  local_8b0._4_4_ = tx_sighash;
  opts.script_len = satoshi;
  opts.satoshi._0_1_ = (flags & 1) != 0;
  opts._40_8_ = value;
  opts.value = (uchar *)value_len;
  opts._0_8_ = index;
  opts.index = (size_t)script;
  opts.script = (uchar *)script_len;
  _Var1 = is_valid_tx(tx);
  if (((((_Var1) && ((script != (uchar *)0x0) == (script_len != 0))) &&
       ((extra != (uchar *)0x0) == (extra_len != 0))) &&
      ((satoshi < 0x775f05a074001 && ((sighash & 0xffffff00) == 0)))) &&
     (((flags & 0xfffffff0) == 0 && ((bytes_out != (uchar *)0x0 && (0x1f < len)))))) {
    if (((extra == (uchar *)0x0) && (extra_len == 0)) && (extra_offset == 0)) {
      if (((index < tx->num_inputs) && ((index < tx->num_outputs || ((sighash & 0x1f) != 3)))) ||
         ((flags & 1) != 0)) {
        opts.value_len._4_4_ = wally_tx_is_elements(tx,&stack0xfffffffffffff798);
        if ((opts.value_len._4_4_ == 0) &&
           (opts.value_len._4_4_ =
                 tx_get_length(tx,(tx_serialize_opts *)local_8b0,0,&n2,sStack_868 != 0),
           opts.value_len._4_4_ == 0)) {
          if ((n2 < 0x801) || (n = (size_t)wally_malloc(n2), (void *)n != (void *)0x0)) {
            opts.value_len._4_4_ =
                 tx_to_bytes(tx,(tx_serialize_opts *)local_8b0,0,(uchar *)n,n2,&is_elements,
                             sStack_868 != 0);
            if (opts.value_len._4_4_ == 0) {
              if (n2 == is_elements) {
                opts.value_len._4_4_ = wally_sha256d((uchar *)n,is_elements,bytes_out,len);
              }
              else {
                opts.value_len._4_4_ = -1;
              }
            }
          }
          else {
            opts.value_len._4_4_ = -3;
          }
        }
        if ((uchar **)n == &buff_p) {
          wally_clear(&buff_p,0x800);
        }
        else {
          clear_and_free((void *)n,n2);
        }
        tx_local._4_4_ = opts.value_len._4_4_;
      }
      else {
        memset(bytes_out,0,0x20);
        *bytes_out = '\x01';
        tx_local._4_4_ = 0;
      }
    }
    else {
      tx_local._4_4_ = -1;
    }
  }
  else {
    tx_local._4_4_ = -2;
  }
  return tx_local._4_4_;
}

Assistant:

static int tx_get_signature_hash(const struct wally_tx *tx,
                                 size_t index,
                                 const unsigned char *script, size_t script_len,
                                 const unsigned char *extra, size_t extra_len,
                                 uint32_t extra_offset, uint64_t satoshi,
                                 const unsigned char *value,
                                 size_t value_len,
                                 uint32_t sighash, uint32_t tx_sighash, uint32_t flags,
                                 unsigned char *bytes_out, size_t len)
{
    unsigned char buff[TX_STACK_SIZE], *buff_p = buff;
    size_t n, n2;
    size_t is_elements = 0;
    int ret;
    const struct tx_serialize_opts opts = {
        sighash, tx_sighash, index, script, script_len, satoshi,
        (flags & WALLY_TX_FLAG_USE_WITNESS) ? true : false,
        value, value_len
    };

    if (!is_valid_tx(tx) || BYTES_INVALID(script, script_len) ||
        BYTES_INVALID(extra, extra_len) ||
        satoshi > WALLY_SATOSHI_MAX || (sighash & 0xffffff00) ||
        (flags & ~WALLY_TX_ALL_FLAGS) || !bytes_out || len < SHA256_LEN)
        return WALLY_EINVAL;

    if (extra || extra_len || extra_offset)
        return WALLY_ERROR; /* FIXME: Not implemented yet */

    if (index >= tx->num_inputs ||
        (index >= tx->num_outputs && (sighash & SIGHASH_MASK) == WALLY_SIGHASH_SINGLE)) {
        if (!(flags & WALLY_TX_FLAG_USE_WITNESS)) {
            memset(bytes_out, 0, SHA256_LEN);
            bytes_out[0] = 0x1;
            return WALLY_OK;
        }
    }

#ifdef BUILD_ELEMENTS
    if ((ret = wally_tx_is_elements(tx, &is_elements)) != WALLY_OK)
        goto fail;
#endif

    if ((ret = tx_get_length(tx, &opts, 0, &n, is_elements != 0)) != WALLY_OK)
        goto fail;

    if (n > sizeof(buff) && (buff_p = wally_malloc(n)) == NULL) {
        ret = WALLY_ENOMEM;
        goto fail;
    }

    if ((ret = tx_to_bytes(tx, &opts, 0, buff_p, n, &n2, is_elements != 0)) != WALLY_OK)
        goto fail;

    if (n != n2)
        ret = WALLY_ERROR; /* tx_get_length/tx_to_bytes mismatch, should not happen! */
    else
        ret = wally_sha256d(buff_p, n2, bytes_out, len);

fail:
    if (buff_p != buff)
        clear_and_free(buff_p, n);
    else
        wally_clear(buff, sizeof(buff));
    return ret;
}